

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

Vector3d * __thiscall
VCClusterAniso::center
          (Vector3d *__return_storage_ptr__,VCClusterAniso *this,Matrix3d *sumK,Vector3d *sumKPos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar11 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  dVar1 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[3];
  dVar15 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  dVar6 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[8];
  dVar7 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[4];
  dVar8 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[5];
  dVar12 = dVar6 * dVar7 - dVar8 * dVar15;
  dVar13 = dVar11 * dVar8 - dVar1 * dVar6;
  dVar14 = dVar1 * dVar15 - dVar7 * dVar11;
  dVar9 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
  dVar10 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  dVar2 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[2];
  dVar16 = dVar13 * dVar10 + dVar14 * dVar2 + dVar12 * dVar9;
  if (ABS(dVar16) <= 1e-12) {
    dVar12 = 0.0;
    dVar15 = 0.0;
    dVar11 = 0.0;
  }
  else {
    dVar16 = 1.0 / dVar16;
    dVar3 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
            .array[0];
    dVar4 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
            .array[1];
    dVar5 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
            .array[2];
    dVar12 = dVar5 * dVar14 * dVar16 + dVar4 * dVar13 * dVar16 + dVar3 * dVar12 * dVar16;
    dVar15 = dVar5 * (dVar11 * dVar10 - dVar15 * dVar9) * dVar16 +
             dVar4 * (dVar6 * dVar9 - dVar11 * dVar2) * dVar16 +
             dVar3 * (dVar15 * dVar2 - dVar6 * dVar10) * dVar16;
    dVar11 = (dVar2 * dVar1 - dVar8 * dVar9) * dVar16 * dVar4 +
             (dVar10 * dVar8 - dVar2 * dVar7) * dVar16 * dVar3 +
             (dVar9 * dVar7 - dVar10 * dVar1) * dVar16 * dVar5;
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar15;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar11;
  return __return_storage_ptr__;
}

Assistant:

Vector3d VCClusterAniso::center(const Matrix3d& sumK, const Vector3d &sumKPos)
{
	bool valid;
	Matrix3d sumKInv;
	double det;
	sumK.computeInverseAndDetWithCheck(sumKInv, det, valid);
	if (!valid) {
		return Vector3d(0, 0, 0);
	}
	return sumKInv * sumKPos;
}